

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integers.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  
  uVar1 = 0xfffffffffffffc18;
  do {
    if (obme::_OBME_MASK == (ulong *)0x0) {
      obme::obme_init();
    }
    printf("%lld: %lld \n",uVar1,*obme::_OBME_MASK ^ uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 1000);
  return 1;
}

Assistant:

int main()
{
	long long i = -1000;
	for(; i < 1000; ++i) {
		long long obf = OBME(i);
		printf("%lld: %lld \n", OBME(obf), obf);
	}
	
	return 1;
}